

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void get_length16(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                 cio_read_buffer *buffer,size_t num_bytes)

{
  uint8_t *__src;
  uint16_t uVar1;
  ulong in_RAX;
  ulong extraout_RAX;
  uint16_t field;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((err == CIO_SUCCESS) || (get_length16_cold_1(), (extraout_RAX & 1) != 0)) {
    __src = buffer->fetch_ptr;
    uStack_38 = uStack_38 & 0xffffffffffff;
    memcpy((void *)((long)&uStack_38 + 6),__src,num_bytes);
    buffer->fetch_ptr = __src + num_bytes;
    uVar1 = cio_be16toh(uStack_38._6_2_);
    uStack_38 = CONCAT26(uVar1,(undefined6)uStack_38);
    *(ulong *)((long)handler_context + 8) = (ulong)uVar1;
    *(ulong *)handler_context = (ulong)uVar1;
    get_mask_or_payload((cio_websocket *)handler_context,buffered_stream,buffer);
  }
  return;
}

Assistant:

static void get_length16(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);

	uint16_t field = 0;
	memcpy(&field, ptr, num_bytes);
	cio_read_buffer_consume(buffer, num_bytes);
	field = cio_be16toh(field);
	websocket->ws_private.remaining_read_frame_length = (size_t)field;
	websocket->ws_private.read_frame_length = (size_t)field;
	get_mask_or_payload(websocket, buffered_stream, buffer);
}